

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O3

void __thiscall arma::Mat<double>::Mat(Mat<double> *this,Mat<double> *X)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *in_RAX;
  double *__dest;
  uword uVar5;
  char (*x) [39];
  char *local_18;
  
  x = (char (*) [39])&local_18;
  uVar1 = X->n_rows;
  this->n_rows = uVar1;
  uVar2 = X->n_cols;
  this->n_cols = uVar2;
  uVar3 = X->n_elem;
  this->n_elem = uVar3;
  uVar4 = X->n_alloc;
  this->n_alloc = uVar4;
  this->vec_state = 0;
  this->mem_state = 0;
  this->mem = (double *)0x0;
  if ((ushort)(X->mem_state - 1) < 2 || 0x10 < uVar4) {
    this->mem_state = X->mem_state;
    this->mem = X->mem;
    X->mem_state = 0;
    X->mem = (double *)0x0;
    X->n_rows = 0;
    X->n_cols = 0;
    X->n_elem = 0;
    X->n_alloc = 0;
  }
  else {
    if ((0xffff < uVar2 || 0xffff < uVar1) && (4294967295.0 < (double)uVar2 * (double)uVar1)) {
      local_18 = "Mat::init(): requested size is too large; suggest to enable ARMA_64BIT_WORD";
      arma_stop_logic_error<char_const*>
                ((arma *)&local_18,(char **)CONCAT71((int7)((ulong)X >> 8),0xffff < uVar1));
LAB_0014beef:
      arma_stop_bad_alloc<char[39]>(x);
    }
    if (uVar3 < 0x11) {
      __dest = this->mem_local;
      if ((ulong)uVar3 == 0) {
        __dest = (double *)0x0;
      }
      this->mem = __dest;
      uVar5 = 0;
    }
    else {
      x = (char (*) [39])((ulong)uVar3 << 3);
      local_18 = in_RAX;
      __dest = (double *)lkalloc::malloc((size_t)x);
      if (__dest == (double *)0x0) goto LAB_0014beef;
      this->mem = __dest;
      uVar5 = this->n_elem;
    }
    this->n_alloc = uVar5;
    if (__dest != X->mem && (ulong)X->n_elem != 0) {
      memcpy(__dest,X->mem,(ulong)X->n_elem << 3);
    }
    if ((X->mem_state == 0) && (X->n_alloc < 0x11)) {
      X->n_rows = 0;
      X->n_cols = 0;
      X->n_elem = 0;
      X->mem = (double *)0x0;
    }
  }
  return;
}

Assistant:

inline
Mat<eT>::Mat(Mat<eT>&& X)
  : n_rows   (X.n_rows )
  , n_cols   (X.n_cols )
  , n_elem   (X.n_elem )
  , n_alloc  (X.n_alloc)
  , vec_state(0        )
  , mem_state(0        )
  , mem      (         )
  {
  arma_debug_sigprint(arma_str::format("this: %x; X: %x") % this % &X);
  
  if( (X.n_alloc > arma_config::mat_prealloc) || (X.mem_state == 1) || (X.mem_state == 2) )
    {
    access::rw(mem_state) = X.mem_state;
    access::rw(mem)       = X.mem;
    
    access::rw(X.n_rows)    = 0;
    access::rw(X.n_cols)    = 0;
    access::rw(X.n_elem)    = 0;
    access::rw(X.n_alloc)   = 0;
    access::rw(X.mem_state) = 0;
    access::rw(X.mem)       = nullptr;
    }
  else  // condition: (X.n_alloc <= arma_config::mat_prealloc) || (X.mem_state == 0) || (X.mem_state == 3)
    {
    init_cold();
    
    arrayops::copy( memptr(), X.mem, X.n_elem );
    
    if( (X.mem_state == 0) && (X.n_alloc <= arma_config::mat_prealloc) )
      {
      access::rw(X.n_rows) = 0;
      access::rw(X.n_cols) = 0;
      access::rw(X.n_elem) = 0;
      access::rw(X.mem)    = nullptr;
      }
    }
  }